

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientService.cpp
# Opt level: O2

void __thiscall ClientService::setServerIP(ClientService *this,string *ip)

{
  int port;
  ClientSocketUDP *this_00;
  string sStack_38;
  
  std::__cxx11::string::_M_assign((string *)this);
  this_00 = (ClientSocketUDP *)operator_new(0x28);
  port = this->serverPort;
  std::__cxx11::string::string((string *)&sStack_38,(string *)this);
  ClientSocketUDP::ClientSocketUDP(this_00,2,2,0,port,&sStack_38);
  this->clientSocketUDP = this_00;
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void ClientService::setServerIP(string ip) {
    this->serverIp = ip;
    clientSocketUDP = new ClientSocketUDP(AF_INET, SOCK_DGRAM, 0, serverPort, serverIp);
}